

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setAttributeClientMem
          (Program *this,void *attrData,VarSpec *attrSpec,string *shaderNameManglingSuffix)

{
  bool bVar1;
  GLuint GVar2;
  int size;
  GLchar *name;
  string local_50;
  GLuint local_2c;
  string *psStack_28;
  int attrLoc;
  string *shaderNameManglingSuffix_local;
  VarSpec *attrSpec_local;
  void *attrData_local;
  Program *this_local;
  
  GVar2 = this->m_programGL;
  psStack_28 = shaderNameManglingSuffix;
  shaderNameManglingSuffix_local = &attrSpec->name;
  attrSpec_local = (VarSpec *)attrData;
  attrData_local = this;
  mangleShaderNames(&local_50,&attrSpec->name,shaderNameManglingSuffix);
  name = (GLchar *)std::__cxx11::string::c_str();
  GVar2 = glwGetAttribLocation(GVar2,name);
  std::__cxx11::string::~string((string *)&local_50);
  local_2c = GVar2;
  glwEnableVertexAttribArray(GVar2);
  glwBindBuffer(0x8892,0);
  bVar1 = glu::isDataTypeFloatOrVec(*(DataType *)(shaderNameManglingSuffix_local + 1));
  GVar2 = local_2c;
  if (bVar1) {
    size = glu::getDataTypeScalarSize(*(DataType *)(shaderNameManglingSuffix_local + 1));
    glwVertexAttribPointer(GVar2,size,0x1406,'\0',0,attrSpec_local);
  }
  return;
}

Assistant:

void Program::setAttributeClientMem (const void* const attrData, const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glEnableVertexAttribArray(attrLoc);
	glBindBuffer(GL_ARRAY_BUFFER, 0);

	if (glu::isDataTypeFloatOrVec(attrSpec.type))
		glVertexAttribPointer(attrLoc, glu::getDataTypeScalarSize(attrSpec.type), GL_FLOAT, GL_FALSE, 0, attrData);
	else
		DE_ASSERT(false);
}